

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTree.h
# Opt level: O2

void __thiscall AST::AssignStmt::~AssignStmt(AssignStmt *this)

{
  ~AssignStmt(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

explicit AssignStmt(std::unique_ptr<Expr> ident, std::unique_ptr<Expr> expr)
        : m_ident(std::move(ident))
        , m_expr(std::move(expr)) { }